

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_area.h
# Opt level: O2

void __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeGeometricNormalPredictorArea<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *prediction)

{
  NormalPredictionMode NVar1;
  ulong uVar2;
  CornerIndex ci;
  uint uVar3;
  uint uVar4;
  CornerIndex ci_00;
  VectorD<long,_3> normal;
  VectorD<long,_3> cross;
  VectorD<long,_3> pos_prev;
  VectorD<long,_3> pos_next;
  VertexCornersIterator<draco::CornerTable> cit;
  VectorD<long,_3> pos_cent;
  VectorD<long,_3> delta_prev;
  VectorD<long,_3> delta_next;
  
  uVar4 = corner_id.value_ - 2;
  if ((corner_id.value_ + 1) % 3 != 0) {
    uVar4 = corner_id.value_ + 1;
  }
  if (corner_id.value_ == 0xffffffff) {
    uVar4 = 0xffffffff;
  }
  uVar3 = (-(uint)(corner_id.value_ % 3 != 0) | 2) + corner_id.value_;
  cit.corner_table_ =
       (this->
       super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
       ).mesh_data_.corner_table_;
  cit.left_traversal_ = true;
  if (corner_id.value_ == 0xffffffff) {
    uVar3 = 0xffffffff;
  }
  cit.start_corner_.value_ = corner_id.value_;
  cit.corner_.value_ = corner_id.value_;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  ::GetPositionForCorner
            (&pos_cent,
             &this->
              super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ,corner_id);
  VectorD<long,_3>::VectorD(&normal);
  while (NVar1 = (this->
                 super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                 ).normal_prediction_mode_, corner_id.value_ != 0xffffffff) {
    ci_00.value_ = uVar3;
    ci.value_ = uVar4;
    if (NVar1 != ONE_TRIANGLE) {
      ci.value_ = corner_id.value_ + 1;
      if (ci.value_ % 3 == 0) {
        ci.value_ = corner_id.value_ - 2;
      }
      if (corner_id.value_ % 3 == 0) {
        ci_00.value_ = corner_id.value_ + 2;
      }
      else {
        ci_00.value_ = corner_id.value_ - 1;
      }
    }
    MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::GetPositionForCorner
              (&pos_next,
               &this->
                super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
               ,ci);
    MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::GetPositionForCorner
              (&pos_prev,
               &this->
                super_MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
               ,ci_00);
    VectorD<long,_3>::operator-(&delta_next,&pos_next,&pos_cent);
    VectorD<long,_3>::operator-(&delta_prev,&pos_prev,&pos_cent);
    CrossProduct<long>(&cross,&delta_next,&delta_prev);
    normal.v_._M_elems[0] = cross.v_._M_elems[0] + normal.v_._M_elems[0];
    normal.v_._M_elems[1] = cross.v_._M_elems[1] + normal.v_._M_elems[1];
    normal.v_._M_elems[2] = normal.v_._M_elems[2] + cross.v_._M_elems[2];
    VertexCornersIterator<draco::CornerTable>::Next(&cit);
    corner_id = cit.corner_;
  }
  uVar2 = VectorD<long,_3>::AbsSum(&normal);
  if (NVar1 == ONE_TRIANGLE) {
    uVar2 = (ulong)(int)uVar2;
  }
  if (0x20000000 < (long)uVar2) {
    pos_prev.v_._M_elems[0] = uVar2 >> 0x1d;
    VectorD<long,_3>::operator/(&pos_next,&normal,(Scalar_conflict *)&pos_prev);
    normal.v_._M_elems[2] = pos_next.v_._M_elems[2];
    normal.v_._M_elems[0] = pos_next.v_._M_elems[0];
    normal.v_._M_elems[1] = pos_next.v_._M_elems[1];
  }
  *(ulong *)prediction =
       CONCAT44((undefined4)normal.v_._M_elems[1],(undefined4)normal.v_._M_elems[0]);
  prediction[2] = (int)normal.v_._M_elems[2];
  return;
}

Assistant:

void ComputePredictedValue(CornerIndex corner_id,
                             DataTypeT *prediction) override {
    DRACO_DCHECK(this->IsInitialized());
    typedef typename MeshDataT::CornerTable CornerTable;
    const CornerTable *const corner_table = this->mesh_data_.corner_table();
    // Going to compute the predicted normal from the surrounding triangles
    // according to the connectivity of the given corner table.
    VertexCornersIterator<CornerTable> cit(corner_table, corner_id);
    // Position of central vertex does not change in loop.
    const VectorD<int64_t, 3> pos_cent = this->GetPositionForCorner(corner_id);
    // Computing normals for triangles and adding them up.

    VectorD<int64_t, 3> normal;
    CornerIndex c_next, c_prev;
    while (!cit.End()) {
      // Getting corners.
      if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
        c_next = corner_table->Next(corner_id);
        c_prev = corner_table->Previous(corner_id);
      } else {
        c_next = corner_table->Next(cit.Corner());
        c_prev = corner_table->Previous(cit.Corner());
      }
      const VectorD<int64_t, 3> pos_next = this->GetPositionForCorner(c_next);
      const VectorD<int64_t, 3> pos_prev = this->GetPositionForCorner(c_prev);

      // Computing delta vectors to next and prev.
      const VectorD<int64_t, 3> delta_next = pos_next - pos_cent;
      const VectorD<int64_t, 3> delta_prev = pos_prev - pos_cent;

      // Computing cross product.
      const VectorD<int64_t, 3> cross = CrossProduct(delta_next, delta_prev);

      // Prevent signed integer overflows by doing math as unsigned.
      auto normal_data = reinterpret_cast<uint64_t *>(normal.data());
      auto cross_data = reinterpret_cast<const uint64_t *>(cross.data());
      normal_data[0] = normal_data[0] + cross_data[0];
      normal_data[1] = normal_data[1] + cross_data[1];
      normal_data[2] = normal_data[2] + cross_data[2];

      cit.Next();
    }

    // Convert to int32_t, make sure entries are not too large.
    constexpr int64_t upper_bound = 1 << 29;
    if (this->normal_prediction_mode_ == ONE_TRIANGLE) {
      const int32_t abs_sum = static_cast<int32_t>(normal.AbsSum());
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    } else {
      const int64_t abs_sum = normal.AbsSum();
      if (abs_sum > upper_bound) {
        const int64_t quotient = abs_sum / upper_bound;
        normal = normal / quotient;
      }
    }
    DRACO_DCHECK_LE(normal.AbsSum(), upper_bound);
    prediction[0] = static_cast<int32_t>(normal[0]);
    prediction[1] = static_cast<int32_t>(normal[1]);
    prediction[2] = static_cast<int32_t>(normal[2]);
  }